

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

real __thiscall fasttext::Loss::sigmoid(Loss *this,real x)

{
  float fVar1;
  
  fVar1 = 0.0;
  if (-8.0 <= x) {
    if (8.0 < x) {
      return 1.0;
    }
    fVar1 = (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(long)((x + 8.0) * 512.0 * 0.125 * 0.5)];
  }
  return fVar1;
}

Assistant:

real Loss::sigmoid(real x) const {
  if (x < -MAX_SIGMOID) {
    return 0.0;
  } else if (x > MAX_SIGMOID) {
    return 1.0;
  } else {
    int64_t i =
        int64_t((x + MAX_SIGMOID) * SIGMOID_TABLE_SIZE / MAX_SIGMOID / 2);
    return t_sigmoid_[i];
  }
}